

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisAngularAccelerometerSensor.cpp
# Opt level: O0

void __thiscall
iDynTree::ThreeAxisAngularAccelerometerSensor::~ThreeAxisAngularAccelerometerSensor
          (ThreeAxisAngularAccelerometerSensor *this)

{
  undefined8 *in_RDI;
  ThreeAxisAngularAccelerometerPrivateAttributes *this_00;
  
  *in_RDI = &PTR__ThreeAxisAngularAccelerometerSensor_004faa78;
  this_00 = (ThreeAxisAngularAccelerometerPrivateAttributes *)in_RDI[1];
  if (this_00 != (ThreeAxisAngularAccelerometerPrivateAttributes *)0x0) {
    ThreeAxisAngularAccelerometerPrivateAttributes::~ThreeAxisAngularAccelerometerPrivateAttributes
              (this_00);
    operator_delete(this_00,0xa8);
  }
  LinkSensor::~LinkSensor((LinkSensor *)0x48a991);
  return;
}

Assistant:

ThreeAxisAngularAccelerometerSensor::~ThreeAxisAngularAccelerometerSensor()
{
    delete this->pimpl;
}